

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

void read_bytes<int,int>(void *ptr,size_t n_els,FILE **in,
                        vector<char,_std::allocator<char>_> *buffer,bool diff_endian)

{
  undefined3 in_register_00000081;
  
  read_bytes<int>(ptr,n_els,in);
  if (CONCAT31(in_register_00000081,diff_endian) != 0) {
    read_bytes<int,int>();
  }
  return;
}

Assistant:

void read_bytes(void *ptr, const size_t n_els, FILE *&in, std::vector<char> &buffer, const bool diff_endian)
{
    if (std::is_same<dtype, saved_type>::value)
    {
        read_bytes<dtype>(ptr, n_els, in);
        if (unlikely(diff_endian)) swap_endianness((dtype*)ptr, n_els);
        return;
    }
    if (n_els == 0) return;
    if (unlikely(feof(in))) throw_feoferr();
    if (unlikely(buffer.size() < n_els * sizeof(saved_type)))
        buffer.resize((size_t)2 * n_els * sizeof(saved_type));
    size_t n_read = fread(buffer.data(), sizeof(saved_type), n_els, in);
    if (unlikely(n_read != n_els || ferror(in))) throw_ferror(in);

    if (unlikely(diff_endian)) swap_endianness((saved_type*)buffer.data(), n_els);
    convert_dtype<dtype, saved_type>(ptr, buffer, n_els);
}